

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::firstVisibleItem(QTreeViewPrivate *this,int *offset)

{
  int iVar1;
  long lVar2;
  qsizetype qVar3;
  int *in_RSI;
  long in_RDI;
  int i;
  int y;
  int value;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc4;
  QTreeViewPrivate *in_stack_ffffffffffffffc8;
  int local_24;
  int local_20;
  int local_4;
  
  local_4 = QAbstractSlider::value
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(int *)(in_RDI + 0x458) == 0) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = 0;
    }
    if (-1 < local_4) {
      lVar2 = (long)local_4;
      qVar3 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0));
      if (lVar2 < qVar3) {
        return local_4;
      }
    }
    local_4 = -1;
  }
  else if ((*(byte *)(in_RDI + 0x5c0) & 1) == 0) {
    local_20 = 0;
    for (local_24 = 0; qVar3 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0)),
        local_24 < qVar3; local_24 = local_24 + 1) {
      iVar1 = itemHeight(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      local_20 = iVar1 + local_20;
      if (local_4 < local_20) {
        if (in_RSI != (int *)0x0) {
          local_20 = local_20 - local_4;
          iVar1 = itemHeight(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
          *in_RSI = local_20 - iVar1;
        }
        return local_24;
      }
    }
    local_4 = -1;
  }
  else if (*(int *)(in_RDI + 0x5bc) == 0) {
    local_4 = -1;
  }
  else {
    if (in_RSI != (int *)0x0) {
      *in_RSI = -(local_4 % *(int *)(in_RDI + 0x5bc));
    }
    local_4 = local_4 / *(int *)(in_RDI + 0x5bc);
  }
  return local_4;
}

Assistant:

int QTreeViewPrivate::firstVisibleItem(int *offset) const
{
    const int value = vbar->value();
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (offset)
            *offset = 0;
        return (value < 0 || value >= viewItems.size()) ? -1 : value;
    }
    // ScrollMode == ScrollPerPixel
    if (uniformRowHeights) {
        if (!defaultItemHeight)
            return -1;

        if (offset)
            *offset = -(value % defaultItemHeight);
        return value / defaultItemHeight;
    }
    int y = 0; // ### (maybe do like QHeaderView by letting items have startposition)
    for (int i = 0; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value) {
            if (offset)
                *offset = y - value - itemHeight(i);
            return i;
        }
    }
    return -1;
}